

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O2

int mbedtls_ecdsa_write_signature
              (mbedtls_ecdsa_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hlen,
              uchar *sig,size_t *slen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  uchar *__dest;
  size_t *psVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t __n;
  uchar *local_110;
  uchar *local_108;
  size_t *local_100;
  mbedtls_mpi s;
  mbedtls_mpi r;
  uchar buf [141];
  uchar local_3b [11];
  
  local_108 = sig;
  local_100 = slen;
  mbedtls_mpi_init(&r);
  mbedtls_mpi_init(&s);
  uVar2 = mbedtls_ecdsa_sign_det(&ctx->grp,&r,&s,&ctx->d,hash,hlen,md_alg);
  psVar1 = local_100;
  __dest = local_108;
  if (uVar2 == 0) {
    local_110 = local_3b;
    uVar3 = mbedtls_asn1_write_mpi(&local_110,buf,&s);
    uVar2 = uVar3;
    if ((-1 < (int)uVar3) && (uVar2 = mbedtls_asn1_write_mpi(&local_110,buf,&r), -1 < (int)uVar2)) {
      uVar3 = uVar2 + uVar3;
      uVar4 = mbedtls_asn1_write_len(&local_110,buf,(ulong)uVar3);
      uVar2 = uVar4;
      if ((-1 < (int)uVar4) && (uVar2 = mbedtls_asn1_write_tag(&local_110,buf,'0'), -1 < (int)uVar2)
         ) {
        __n = (ulong)uVar3 + (ulong)uVar2 + (ulong)uVar4;
        memcpy(__dest,local_110,__n);
        *psVar1 = __n;
        uVar2 = 0;
      }
    }
  }
  mbedtls_mpi_free(&r);
  mbedtls_mpi_free(&s);
  return uVar2;
}

Assistant:

int mbedtls_ecdsa_write_signature( mbedtls_ecdsa_context *ctx, mbedtls_md_type_t md_alg,
                           const unsigned char *hash, size_t hlen,
                           unsigned char *sig, size_t *slen,
                           int (*f_rng)(void *, unsigned char *, size_t),
                           void *p_rng )
{
    int ret;
    mbedtls_mpi r, s;

    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    (void) f_rng;
    (void) p_rng;

    MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign_det( &ctx->grp, &r, &s, &ctx->d,
                             hash, hlen, md_alg ) );
#else
    (void) md_alg;

    MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign( &ctx->grp, &r, &s, &ctx->d,
                         hash, hlen, f_rng, p_rng ) );
#endif

    MBEDTLS_MPI_CHK( ecdsa_signature_to_asn1( &r, &s, sig, slen ) );

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );

    return( ret );
}